

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O2

Result __thiscall
wabt::SharedValidator::OnLoad(SharedValidator *this,Location *loc,Opcode opcode,Address alignment)

{
  Result RVar1;
  Address natural_alignment;
  Result RVar2;
  Result RVar3;
  Opcode local_7c;
  Var local_78;
  
  this->expr_loc_ = loc;
  local_7c.enum_ = opcode.enum_;
  Var::Var(&local_78,0,loc);
  RVar1 = CheckMemoryIndex(this,&local_78,(MemoryType *)0x0);
  Var::~Var(&local_78);
  natural_alignment = Opcode::GetMemorySize(&local_7c);
  RVar2 = CheckAlign(this,loc,alignment,natural_alignment);
  RVar3 = TypeChecker::OnLoad(&this->typechecker_,local_7c);
  RVar1.enum_._0_1_ = RVar3.enum_ == Error || (RVar2.enum_ == Error || RVar1.enum_ == Error);
  RVar1.enum_._1_3_ = 0;
  return (Result)RVar1.enum_;
}

Assistant:

Result SharedValidator::OnLoad(const Location& loc,
                               Opcode opcode,
                               Address alignment) {
  Result result = Result::Ok;
  expr_loc_ = &loc;
  result |= CheckMemoryIndex(Var(0, loc));
  result |= CheckAlign(loc, alignment, opcode.GetMemorySize());
  result |= typechecker_.OnLoad(opcode);
  return result;
}